

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_evaluator.cpp
# Opt level: O0

void __thiscall
TestEvaluator_TestFunctionCall_Test::~TestEvaluator_TestFunctionCall_Test
          (TestEvaluator_TestFunctionCall_Test *this)

{
  TestEvaluator_TestFunctionCall_Test *this_local;
  
  ~TestEvaluator_TestFunctionCall_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestEvaluator, TestFunctionCall){
    cout << R"(
            ---- test_functioncall ----
            )" << endl;
    string buff = R"(init counter = define(x){
                  if(x > 0){
                     return true
                  }else{
                    init foobar = 9999
                    counter(x+1)
                   }
                 }
                 counter(0)
                  )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto env = Evaluator::NewEnvironment();
    auto program = parser->parseProgram();
    auto obj = Evaluator::evalProgram(program, env);
    EXPECT_TRUE(!obj.empty());
    EXPECT_EQ(obj.size(), 2);
}